

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_char>::get_index<unsigned_char>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_char> *this,
          CImg<unsigned_char> *colormap,float dithering,bool map_indexes)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  CImgArgumentException *this_00;
  byte *pbVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  uchar *puVar13;
  uchar *puVar14;
  float *pfVar15;
  float *pfVar16;
  float fVar17;
  float local_630;
  float local_62c;
  float local_624;
  float local_620;
  float local_61c;
  float local_618;
  float local_614;
  float local_610;
  float local_608;
  float local_604;
  float local_600;
  float local_5fc;
  float local_5f4;
  float local_5f0;
  uint local_5c8;
  int local_564;
  uint *puStack_560;
  int c_5;
  tuint *_ptrd_1;
  byte *pbStack_550;
  int c_4;
  uchar *_ptrp_1;
  uchar *_ptrs_3;
  uchar *puStack_538;
  Tfloat dist_7;
  uchar *ptrp_end_7;
  uchar *ptrp_1;
  uchar *ptrmin_1;
  uchar *puStack_518;
  Tfloat distmin_7;
  uchar *ptrs_end_3;
  uchar *ptrs_1;
  tuint *ptrd_4;
  int y_7;
  int z_7;
  Tfloat dist_6;
  Tfloat pval2_1;
  Tfloat pval1_3;
  Tfloat pval0_5;
  uchar *ptrp_end_6;
  uchar *ptrp2_1;
  uchar *ptrp1_3;
  uchar *ptrp0_5;
  uchar *ptrmin0_5;
  Tfloat distmin_6;
  Tfloat val2_1;
  Tfloat val1_3;
  Tfloat val0_5;
  uchar *ptrs_end_2;
  uchar *ptrs2_2;
  uchar *ptrs1_5;
  uchar *ptrs0_8;
  tuint *ptrd2_1;
  tuint *ptrd1_3;
  tuint *ptrd_3;
  uint local_470;
  int y_6;
  int z_6;
  Tfloat dist_5;
  Tfloat pval1_2;
  Tfloat pval0_4;
  uchar *ptrp_end_5;
  uchar *ptrp1_2;
  uchar *ptrp0_4;
  uchar *ptrmin0_4;
  float local_438;
  Tfloat distmin_5;
  Tfloat val1_2;
  Tfloat val0_4;
  uchar *ptrs_end_1;
  uchar *ptrs1_4;
  uchar *ptrs0_7;
  tuint *ptrd1_2;
  tuint *ptrd_2;
  int y_5;
  int z_5;
  Tfloat dist_4;
  Tfloat pval0_3;
  uchar *ptrp_end_4;
  uchar *ptrp0_3;
  uchar *ptrmin0_3;
  Tfloat distmin_4;
  Tfloat val0_3;
  uchar *ptrs_end;
  uchar *ptrs0_6;
  tuint *ptrd_1;
  uint local_3b8;
  int y_4;
  int z_4;
  int c_3;
  tuint *_ptrd;
  Tfloat err;
  int c_2;
  Tfloat *_ptrsn;
  Tfloat *_ptrs_1;
  uchar *_ptrmin;
  float local_380;
  Tfloat val;
  Tfloat _val;
  int c_1;
  uchar *_ptrp;
  Tfloat *_ptrs_2;
  uchar *puStack_360;
  Tfloat dist_3;
  uchar *ptrp_end_3;
  uchar *ptrp;
  uchar *ptrmin;
  Tfloat distmin_3;
  int x_7;
  Tfloat *ptrsn;
  Tfloat *ptrs;
  byte *pbStack_328;
  int x_6;
  uchar *_ptrs;
  Tfloat *_ptrc;
  uchar *puStack_310;
  int c;
  Tfloat *ptrc;
  uint local_300;
  int y_3;
  int z_3;
  Tfloat err2;
  Tfloat err1_1;
  Tfloat err0_2;
  uchar *ptrmin2;
  uchar *ptrmin1_1;
  Tfloat dist_2;
  Tfloat pval2;
  Tfloat pval1_1;
  Tfloat pval0_2;
  uchar *ptrp_end_2;
  uchar *ptrp2;
  uchar *ptrp1_1;
  uchar *ptrp0_2;
  uchar *ptrmin0_2;
  Tfloat distmin_2;
  Tfloat val2;
  Tfloat _val2;
  Tfloat val1_1;
  Tfloat _val1_1;
  Tfloat val0_2;
  Tfloat _val0_2;
  int x_5;
  Tfloat *ptrsn2;
  Tfloat *ptrsn1_1;
  Tfloat *ptrsn0_2;
  Tfloat *ptrs2;
  Tfloat *ptrs1_2;
  Tfloat *ptrs0_4;
  byte *pbStack_250;
  int x_4;
  uchar *ptrs2_1;
  uchar *ptrs1_3;
  uchar *ptrs0_5;
  Tfloat *ptrc2;
  Tfloat *ptrc1_1;
  Tfloat *ptrc0_2;
  int y_2;
  int z_2;
  tuint *ptrd2;
  tuint *ptrd1_1;
  Tfloat err1;
  Tfloat err0_1;
  uchar *ptrmin1;
  float local_1f0;
  Tfloat dist_1;
  Tfloat pval1;
  Tfloat pval0_1;
  uchar *ptrp_end_1;
  uchar *ptrp1;
  uchar *ptrp0_1;
  uchar *ptrmin0_1;
  Tfloat distmin_1;
  Tfloat val1;
  Tfloat _val1;
  Tfloat val0_1;
  Tfloat _val0_1;
  int x_3;
  Tfloat *ptrsn1;
  Tfloat *ptrsn0_1;
  Tfloat *ptrs1;
  Tfloat *ptrs0_2;
  byte *pbStack_188;
  int x_2;
  uchar *ptrs1_1;
  uchar *ptrs0_3;
  Tfloat *ptrc1;
  Tfloat *ptrc0_1;
  int y_1;
  int z_1;
  tuint *ptrd1;
  float local_150;
  Tfloat err0;
  Tfloat dist;
  Tfloat pval0;
  uchar *ptrp_end;
  uchar *ptrp0;
  uchar *ptrmin0;
  Tfloat distmin;
  Tfloat val0;
  Tfloat _val0;
  int x_1;
  Tfloat *ptrsn0;
  Tfloat *ptrs0;
  byte *pbStack_108;
  int x;
  uchar *ptrs0_1;
  Tfloat *ptrc0;
  int y;
  int z;
  ulongT cwhd;
  Tfloat *cache_next;
  Tfloat *cache_current;
  undefined1 local_b8 [8];
  CImg<float> cache;
  float local_90;
  Tfloat valM;
  Tfloat valm;
  float local_84;
  uint *puStack_80;
  float ndithering;
  tuint *ptrd;
  long local_70;
  ulongT pwhd;
  ulongT whd;
  byte local_4d;
  float local_4c;
  bool map_indexes_local;
  CImg<unsigned_char> *pCStack_48;
  float dithering_local;
  CImg<unsigned_char> *colormap_local;
  CImg<unsigned_char> *this_local;
  CImg<unsigned_int> *res;
  
  local_4d = map_indexes;
  local_4c = dithering;
  pCStack_48 = colormap;
  colormap_local = this;
  this_local = (CImg<unsigned_char> *)__return_storage_ptr__;
  if (colormap->_spectrum == this->_spectrum) {
    bVar6 = is_empty(this);
    if (bVar6) {
      CImg<unsigned_int>::CImg(__return_storage_ptr__);
    }
    else {
      pwhd = (ulong)this->_width * (ulong)this->_height * (ulong)this->_depth;
      local_70 = (ulong)pCStack_48->_width * (ulong)pCStack_48->_height * (ulong)pCStack_48->_depth;
      ptrd._7_1_ = 0;
      if ((local_4d & 1) == 0) {
        local_5c8 = 1;
      }
      else {
        local_5c8 = this->_spectrum;
      }
      CImg<unsigned_int>::CImg
                (__return_storage_ptr__,this->_width,this->_height,this->_depth,local_5c8);
      if (local_4c <= 0.0) {
        uVar1 = this->_spectrum;
        if (uVar1 == 1) {
          for (local_3b8 = 0; (int)local_3b8 < (int)this->_depth; local_3b8 = local_3b8 + 1) {
            for (ptrd_1._4_4_ = 0; (int)ptrd_1._4_4_ < (int)this->_height;
                ptrd_1._4_4_ = ptrd_1._4_4_ + 1) {
              ptrs0_6 = (uchar *)CImg<unsigned_int>::data
                                           (__return_storage_ptr__,0,ptrd_1._4_4_,local_3b8,0);
              ptrs_end = data(this,0,ptrd_1._4_4_,local_3b8,0);
              _distmin_4 = ptrs_end + this->_width;
              while (ptrs_end < _distmin_4) {
                ptrmin0_3._4_4_ = (float)*ptrs_end;
                ptrs_end = ptrs_end + 1;
                ptrmin0_3._0_4_ = cimg::type<float>::max();
                ptrp0_3 = pCStack_48->_data;
                _dist_4 = pCStack_48->_data + local_70;
                puVar13 = pCStack_48->_data;
                while (ptrp_end_4 = puVar13, ptrp_end_4 < _dist_4) {
                  z_5 = (int)((float)*ptrp_end_4 - ptrmin0_3._4_4_);
                  y_5 = (int)((float)z_5 * (float)z_5);
                  puVar13 = ptrp_end_4 + 1;
                  if ((float)y_5 < ptrmin0_3._0_4_) {
                    ptrp0_3 = ptrp_end_4;
                    ptrmin0_3._0_4_ = (float)y_5;
                  }
                }
                if ((local_4d & 1) == 0) {
                  *(int *)ptrs0_6 = (int)ptrp0_3 - (int)pCStack_48->_data;
                }
                else {
                  *(uint *)ptrs0_6 = (uint)*ptrp0_3;
                }
                ptrs0_6 = ptrs0_6 + 4;
              }
            }
          }
        }
        else if (uVar1 == 2) {
          for (ptrd_2._4_4_ = 0; (int)ptrd_2._4_4_ < (int)this->_depth;
              ptrd_2._4_4_ = ptrd_2._4_4_ + 1) {
            for (ptrd_2._0_4_ = 0; (int)(uint)ptrd_2 < (int)this->_height;
                ptrd_2._0_4_ = (uint)ptrd_2 + 1) {
              ptrd1_2 = CImg<unsigned_int>::data
                                  (__return_storage_ptr__,0,(uint)ptrd_2,ptrd_2._4_4_,0);
              ptrs0_7 = (uchar *)(ptrd1_2 + pwhd);
              ptrs1_4 = data(this,0,(uint)ptrd_2,ptrd_2._4_4_,0);
              ptrs_end_1 = ptrs1_4 + pwhd;
              _val1_2 = ptrs1_4 + this->_width;
              while (ptrs1_4 < _val1_2) {
                distmin_5 = (Tfloat)*ptrs1_4;
                local_438 = (float)*ptrs_end_1;
                ptrs_end_1 = ptrs_end_1 + 1;
                ptrs1_4 = ptrs1_4 + 1;
                ptrmin0_4._4_4_ = cimg::type<float>::max();
                ptrp0_4 = pCStack_48->_data;
                _pval1_2 = pCStack_48->_data + local_70;
                ptrp_end_5 = _pval1_2;
                puVar13 = pCStack_48->_data;
                while (ptrp1_2 = puVar13, ptrp1_2 < _pval1_2) {
                  dist_5 = (float)*ptrp1_2 - distmin_5;
                  puVar13 = ptrp_end_5 + 1;
                  z_6 = (int)((float)*ptrp_end_5 - local_438);
                  y_6 = (int)(dist_5 * dist_5 + (float)z_6 * (float)z_6);
                  ptrp_end_5 = puVar13;
                  puVar13 = ptrp1_2 + 1;
                  if ((float)y_6 < ptrmin0_4._4_4_) {
                    ptrp0_4 = ptrp1_2;
                    ptrmin0_4._4_4_ = (float)y_6;
                  }
                }
                if ((local_4d & 1) == 0) {
                  *ptrd1_2 = (int)ptrp0_4 - (int)pCStack_48->_data;
                }
                else {
                  *ptrd1_2 = (uint)*ptrp0_4;
                  *(uint *)ptrs0_7 = (uint)ptrp0_4[local_70];
                  ptrs0_7 = ptrs0_7 + 4;
                }
                ptrd1_2 = ptrd1_2 + 1;
              }
            }
          }
        }
        else if (uVar1 == 3) {
          for (local_470 = 0; (int)local_470 < (int)this->_depth; local_470 = local_470 + 1) {
            for (ptrd_3._4_4_ = 0; (int)ptrd_3._4_4_ < (int)this->_height;
                ptrd_3._4_4_ = ptrd_3._4_4_ + 1) {
              ptrd1_3 = CImg<unsigned_int>::data(__return_storage_ptr__,0,ptrd_3._4_4_,local_470,0);
              ptrd2_1 = ptrd1_3 + pwhd;
              ptrs0_8 = (uchar *)(ptrd2_1 + pwhd);
              ptrs1_5 = data(this,0,ptrd_3._4_4_,local_470,0);
              ptrs2_2 = ptrs1_5 + pwhd;
              ptrs_end_2 = ptrs2_2 + pwhd;
              _val1_3 = ptrs1_5 + this->_width;
              while (ptrs1_5 < _val1_3) {
                val2_1 = (Tfloat)*ptrs1_5;
                distmin_6 = (Tfloat)*ptrs2_2;
                ptrmin0_5._4_4_ = (float)*ptrs_end_2;
                ptrs_end_2 = ptrs_end_2 + 1;
                ptrs2_2 = ptrs2_2 + 1;
                ptrs1_5 = ptrs1_5 + 1;
                ptrmin0_5._0_4_ = cimg::type<float>::max();
                ptrp0_5 = pCStack_48->_data;
                _pval1_3 = pCStack_48->_data + local_70;
                ptrp_end_6 = _pval1_3 + local_70;
                ptrp2_1 = _pval1_3;
                puVar13 = pCStack_48->_data;
                while (ptrp1_3 = puVar13, ptrp1_3 < _pval1_3) {
                  pval2_1 = (float)*ptrp1_3 - val2_1;
                  puVar13 = ptrp2_1 + 1;
                  dist_6 = (float)*ptrp2_1 - distmin_6;
                  puVar14 = ptrp_end_6 + 1;
                  z_7 = (int)((float)*ptrp_end_6 - ptrmin0_5._4_4_);
                  y_7 = (int)((float)z_7 * (float)z_7 + pval2_1 * pval2_1 + dist_6 * dist_6);
                  ptrp_end_6 = puVar14;
                  ptrp2_1 = puVar13;
                  puVar13 = ptrp1_3 + 1;
                  if ((float)y_7 < ptrmin0_5._0_4_) {
                    ptrp0_5 = ptrp1_3;
                    ptrmin0_5._0_4_ = (float)y_7;
                  }
                }
                if ((local_4d & 1) == 0) {
                  *ptrd1_3 = (int)ptrp0_5 - (int)pCStack_48->_data;
                }
                else {
                  *ptrd1_3 = (uint)*ptrp0_5;
                  *ptrd2_1 = (uint)ptrp0_5[local_70];
                  *(uint *)ptrs0_8 = (uint)ptrp0_5[local_70 * 2];
                  ptrs0_8 = ptrs0_8 + 4;
                  ptrd2_1 = ptrd2_1 + 1;
                }
                ptrd1_3 = ptrd1_3 + 1;
              }
            }
          }
        }
        else {
          for (ptrd_4._4_4_ = 0; (int)ptrd_4._4_4_ < (int)this->_depth;
              ptrd_4._4_4_ = ptrd_4._4_4_ + 1) {
            for (ptrd_4._0_4_ = 0; (int)(uint)ptrd_4 < (int)this->_height;
                ptrd_4._0_4_ = (uint)ptrd_4 + 1) {
              ptrs_1 = (uchar *)CImg<unsigned_int>::data
                                          (__return_storage_ptr__,0,(uint)ptrd_4,ptrd_4._4_4_,0);
              ptrs_end_3 = data(this,0,(uint)ptrd_4,ptrd_4._4_4_,0);
              puStack_518 = ptrs_end_3 + this->_width;
              for (; ptrs_end_3 < puStack_518; ptrs_end_3 = ptrs_end_3 + 1) {
                ptrmin_1._4_4_ = cimg::type<float>::max();
                ptrp_1 = pCStack_48->_data;
                ptrp_end_7 = pCStack_48->_data;
                puStack_538 = ptrp_end_7 + local_70;
                for (; ptrp_end_7 < puStack_538; ptrp_end_7 = ptrp_end_7 + 1) {
                  _ptrs_3._4_4_ = 0.0;
                  _ptrp_1 = ptrs_end_3;
                  pbStack_550 = ptrp_end_7;
                  for (_ptrd_1._4_4_ = 0; _ptrd_1._4_4_ < (int)this->_spectrum;
                      _ptrd_1._4_4_ = _ptrd_1._4_4_ + 1) {
                    _ptrd_1._0_4_ = (float)*_ptrp_1 - (float)*pbStack_550;
                    fVar17 = cimg::sqr<float>((float *)&_ptrd_1);
                    _ptrs_3._4_4_ = fVar17 + _ptrs_3._4_4_;
                    _ptrp_1 = _ptrp_1 + pwhd;
                    pbStack_550 = pbStack_550 + local_70;
                  }
                  if (_ptrs_3._4_4_ < ptrmin_1._4_4_) {
                    ptrp_1 = ptrp_end_7;
                    ptrmin_1._4_4_ = _ptrs_3._4_4_;
                  }
                }
                if ((local_4d & 1) == 0) {
                  *(int *)ptrs_1 = (int)ptrp_1 - (int)pCStack_48->_data;
                }
                else {
                  puStack_560 = (uint *)ptrs_1;
                  for (local_564 = 0; local_564 < (int)this->_spectrum; local_564 = local_564 + 1) {
                    *puStack_560 = (uint)*ptrp_1;
                    puStack_560 = puStack_560 + pwhd;
                    ptrp_1 = ptrp_1 + local_70;
                  }
                }
                ptrs_1 = ptrs_1 + 4;
              }
            }
          }
        }
      }
      else {
        puStack_80 = __return_storage_ptr__->_data;
        valm = 0.0;
        valM = 1.4013e-45;
        local_84 = cimg::cut<float,int>(&local_4c,(int *)&valm,(int *)&valM);
        local_84 = local_84 * 0.0625;
        local_90 = 0.0;
        pbVar8 = max_min<float>(this,&local_90);
        cache._data._4_4_ = (float)*pbVar8;
        if (((local_90 == cache._data._4_4_) && (0.0 <= local_90)) && (cache._data._4_4_ <= 255.0))
        {
          local_90 = 0.0;
          cache._data._4_4_ = 255.0;
        }
        get_crop((CImg<unsigned_char> *)&cache_current,this,-1,0,0,0,this->_width,1,0,
                 this->_spectrum - 1,0);
        CImg<float>::CImg<unsigned_char>
                  ((CImg<float> *)local_b8,(CImg<unsigned_char> *)&cache_current);
        ~CImg((CImg<unsigned_char> *)&cache_current);
        cache_next = CImg<float>::data((CImg<float> *)local_b8,1,0,0,0);
        cwhd = (ulongT)CImg<float>::data((CImg<float> *)local_b8,1,1,0,0);
        _y = (ulong)(uint)local_b8._0_4_ * (ulong)(uint)local_b8._4_4_ * (ulong)cache._width;
        uVar1 = this->_spectrum;
        if (uVar1 == 1) {
          for (ptrc0._4_4_ = 0; (int)ptrc0._4_4_ < (int)this->_depth; ptrc0._4_4_ = ptrc0._4_4_ + 1)
          {
            for (ptrc0._0_4_ = 0; iVar5 = (int)ptrc0, (int)ptrc0 < (int)this->_height;
                ptrc0._0_4_ = (int)ptrc0 + 1) {
              iVar7 = height(this);
              if (iVar5 < iVar7 + -2) {
                ptrs0_1 = (uchar *)cwhd;
                pbStack_108 = data(this,0,(int)ptrc0 + 1,ptrc0._4_4_,0);
                for (ptrs0._4_4_ = 0; ptrs0._4_4_ < (int)this->_width; ptrs0._4_4_ = ptrs0._4_4_ + 1
                    ) {
                  *(float *)ptrs0_1 = (float)*pbStack_108;
                  pbStack_108 = pbStack_108 + 1;
                  ptrs0_1 = ptrs0_1 + 4;
                }
              }
              ptrsn0 = cache_next;
              __val0 = (float *)cwhd;
              for (val0 = 0.0; (int)val0 < (int)this->_width; val0 = (Tfloat)((int)val0 + 1)) {
                distmin = *ptrsn0;
                if (local_90 <= distmin) {
                  local_5f4 = distmin;
                  if (cache._data._4_4_ < distmin) {
                    local_5f4 = cache._data._4_4_;
                  }
                  local_5f0 = local_5f4;
                }
                else {
                  local_5f0 = local_90;
                }
                ptrmin0._4_4_ = local_5f0;
                ptrmin0._0_4_ = cimg::type<float>::max();
                ptrp0 = pCStack_48->_data;
                _dist = pCStack_48->_data + local_70;
                puVar13 = pCStack_48->_data;
                while (ptrp_end = puVar13, ptrp_end < _dist) {
                  err0 = (float)*ptrp_end - ptrmin0._4_4_;
                  local_150 = err0 * err0;
                  puVar13 = ptrp_end + 1;
                  if (local_150 < ptrmin0._0_4_) {
                    ptrp0 = ptrp_end;
                    ptrmin0._0_4_ = local_150;
                  }
                }
                pfVar9 = ptrsn0 + 1;
                *ptrsn0 = ptrmin0._4_4_;
                ptrd1._4_4_ = (ptrmin0._4_4_ - (float)*ptrp0) * local_84;
                *pfVar9 = ptrd1._4_4_ * 7.0 + *pfVar9;
                __val0[-1] = ptrd1._4_4_ * 3.0 + __val0[-1];
                pfVar10 = __val0 + 1;
                *__val0 = ptrd1._4_4_ * 5.0 + *__val0;
                *pfVar10 = ptrd1._4_4_ + *pfVar10;
                if ((local_4d & 1) == 0) {
                  *puStack_80 = (int)ptrp0 - (int)pCStack_48->_data;
                }
                else {
                  *puStack_80 = (uint)*ptrp0;
                }
                puStack_80 = puStack_80 + 1;
                __val0 = pfVar10;
                ptrsn0 = pfVar9;
              }
              cimg::swap<float*>(&cache_next,(float **)&cwhd);
            }
          }
        }
        else if (uVar1 == 2) {
          _y_1 = puStack_80 + pwhd;
          for (ptrc0_1._4_4_ = 0; (int)ptrc0_1._4_4_ < (int)this->_depth;
              ptrc0_1._4_4_ = ptrc0_1._4_4_ + 1) {
            for (ptrc0_1._0_4_ = 0; iVar5 = (int)ptrc0_1, (int)ptrc0_1 < (int)this->_height;
                ptrc0_1._0_4_ = (int)ptrc0_1 + 1) {
              iVar7 = height(this);
              if (iVar5 < iVar7 + -2) {
                ptrc1 = (Tfloat *)cwhd;
                ptrs0_3 = (uchar *)(cwhd + _y * 4);
                ptrs1_1 = data(this,0,(int)ptrc0_1 + 1,ptrc0_1._4_4_,0);
                pbStack_188 = ptrs1_1 + pwhd;
                for (ptrs0_2._4_4_ = 0; ptrs0_2._4_4_ < (int)this->_width;
                    ptrs0_2._4_4_ = ptrs0_2._4_4_ + 1) {
                  *ptrc1 = (float)*ptrs1_1;
                  *(float *)ptrs0_3 = (float)*pbStack_188;
                  pbStack_188 = pbStack_188 + 1;
                  ptrs1_1 = ptrs1_1 + 1;
                  ptrs0_3 = ptrs0_3 + 4;
                  ptrc1 = ptrc1 + 1;
                }
              }
              ptrs1 = cache_next;
              ptrsn1 = (Tfloat *)cwhd;
              __val0_1 = (float *)(cwhd + _y * 4);
              ptrsn0_1 = cache_next + _y;
              for (val0_1 = 0.0; (int)val0_1 < (int)this->_width; val0_1 = (Tfloat)((int)val0_1 + 1)
                  ) {
                _val1 = *ptrs1;
                if (local_90 <= _val1) {
                  local_600 = _val1;
                  if (cache._data._4_4_ < _val1) {
                    local_600 = cache._data._4_4_;
                  }
                  local_5fc = local_600;
                }
                else {
                  local_5fc = local_90;
                }
                val1 = local_5fc;
                distmin_1 = *ptrsn0_1;
                if (local_90 <= distmin_1) {
                  local_608 = distmin_1;
                  if (cache._data._4_4_ < distmin_1) {
                    local_608 = cache._data._4_4_;
                  }
                  local_604 = local_608;
                }
                else {
                  local_604 = local_90;
                }
                ptrmin0_1._4_4_ = local_604;
                ptrmin0_1._0_4_ = cimg::type<float>::max();
                ptrp0_1 = pCStack_48->_data;
                _pval1 = pCStack_48->_data + local_70;
                ptrp_end_1 = _pval1;
                puVar13 = pCStack_48->_data;
                while (ptrp1 = puVar13, ptrp1 < _pval1) {
                  dist_1 = (float)*ptrp1 - val1;
                  puVar13 = ptrp_end_1 + 1;
                  local_1f0 = (float)*ptrp_end_1 - ptrmin0_1._4_4_;
                  ptrmin1._4_4_ = dist_1 * dist_1 + local_1f0 * local_1f0;
                  ptrp_end_1 = puVar13;
                  puVar13 = ptrp1 + 1;
                  if (ptrmin1._4_4_ < ptrmin0_1._0_4_) {
                    ptrp0_1 = ptrp1;
                    ptrmin0_1._0_4_ = ptrmin1._4_4_;
                  }
                }
                _err1 = ptrp0_1 + local_70;
                pfVar9 = ptrs1 + 1;
                *ptrs1 = val1;
                ptrd1_1._4_4_ = (val1 - (float)*ptrp0_1) * local_84;
                pfVar10 = ptrsn0_1 + 1;
                *ptrsn0_1 = ptrmin0_1._4_4_;
                ptrd1_1._0_4_ = (ptrmin0_1._4_4_ - (float)*_err1) * local_84;
                *pfVar9 = ptrd1_1._4_4_ * 7.0 + *pfVar9;
                *pfVar10 = ptrd1_1._0_4_ * 7.0 + *pfVar10;
                ptrsn1[-1] = ptrd1_1._4_4_ * 3.0 + ptrsn1[-1];
                __val0_1[-1] = ptrd1_1._0_4_ * 3.0 + __val0_1[-1];
                pfVar11 = ptrsn1 + 1;
                *ptrsn1 = ptrd1_1._4_4_ * 5.0 + *ptrsn1;
                pfVar12 = __val0_1 + 1;
                *__val0_1 = ptrd1_1._0_4_ * 5.0 + *__val0_1;
                *pfVar11 = ptrd1_1._4_4_ + *pfVar11;
                *pfVar12 = ptrd1_1._0_4_ + *pfVar12;
                if ((local_4d & 1) == 0) {
                  *puStack_80 = (int)ptrp0_1 - (int)pCStack_48->_data;
                }
                else {
                  *puStack_80 = (uint)*ptrp0_1;
                  *_y_1 = (uint)*_err1;
                  _y_1 = _y_1 + 1;
                }
                puStack_80 = puStack_80 + 1;
                __val0_1 = pfVar12;
                ptrsn1 = pfVar11;
                ptrsn0_1 = pfVar10;
                ptrs1 = pfVar9;
              }
              cimg::swap<float*>(&cache_next,(float **)&cwhd);
            }
          }
        }
        else if (uVar1 == 3) {
          ptrd2 = puStack_80 + pwhd;
          _y_2 = ptrd2 + pwhd;
          for (ptrc0_2._4_4_ = 0; (int)ptrc0_2._4_4_ < (int)this->_depth;
              ptrc0_2._4_4_ = ptrc0_2._4_4_ + 1) {
            for (ptrc0_2._0_4_ = 0; iVar5 = (int)ptrc0_2, (int)ptrc0_2 < (int)this->_height;
                ptrc0_2._0_4_ = (int)ptrc0_2 + 1) {
              iVar7 = height(this);
              if (iVar5 < iVar7 + -2) {
                ptrc1_1 = (Tfloat *)cwhd;
                ptrc2 = (Tfloat *)(cwhd + _y * 4);
                ptrs0_5 = (uchar *)(ptrc2 + _y);
                ptrs1_3 = data(this,0,(int)ptrc0_2 + 1,ptrc0_2._4_4_,0);
                pbStack_250 = ptrs1_3 + pwhd + pwhd;
                ptrs2_1 = ptrs1_3 + pwhd;
                for (ptrs0_4._4_4_ = 0; ptrs0_4._4_4_ < (int)this->_width;
                    ptrs0_4._4_4_ = ptrs0_4._4_4_ + 1) {
                  *ptrc1_1 = (float)*ptrs1_3;
                  *ptrc2 = (float)*ptrs2_1;
                  *(float *)ptrs0_5 = (float)*pbStack_250;
                  pbStack_250 = pbStack_250 + 1;
                  ptrs2_1 = ptrs2_1 + 1;
                  ptrs1_3 = ptrs1_3 + 1;
                  ptrs0_5 = ptrs0_5 + 4;
                  ptrc2 = ptrc2 + 1;
                  ptrc1_1 = ptrc1_1 + 1;
                }
              }
              ptrs1_2 = cache_next;
              ptrsn1_1 = (Tfloat *)cwhd;
              ptrsn2 = (Tfloat *)(cwhd + _y * 4);
              __val0_2 = ptrsn2 + _y;
              ptrsn0_2 = cache_next + _y + _y;
              ptrs2 = cache_next + _y;
              for (val0_2 = 0.0; (int)val0_2 < (int)this->_width; val0_2 = (Tfloat)((int)val0_2 + 1)
                  ) {
                _val1_1 = *ptrs1_2;
                if (local_90 <= _val1_1) {
                  local_614 = _val1_1;
                  if (cache._data._4_4_ < _val1_1) {
                    local_614 = cache._data._4_4_;
                  }
                  local_610 = local_614;
                }
                else {
                  local_610 = local_90;
                }
                val1_1 = local_610;
                _val2 = *ptrs2;
                if (local_90 <= _val2) {
                  local_61c = _val2;
                  if (cache._data._4_4_ < _val2) {
                    local_61c = cache._data._4_4_;
                  }
                  local_618 = local_61c;
                }
                else {
                  local_618 = local_90;
                }
                val2 = local_618;
                distmin_2 = *ptrsn0_2;
                if (local_90 <= distmin_2) {
                  local_624 = distmin_2;
                  if (cache._data._4_4_ < distmin_2) {
                    local_624 = cache._data._4_4_;
                  }
                  local_620 = local_624;
                }
                else {
                  local_620 = local_90;
                }
                ptrmin0_2._4_4_ = local_620;
                ptrmin0_2._0_4_ = cimg::type<float>::max();
                ptrp0_2 = pCStack_48->_data;
                _pval1_1 = pCStack_48->_data + local_70;
                ptrp_end_2 = _pval1_1 + local_70;
                ptrp2 = _pval1_1;
                puVar13 = pCStack_48->_data;
                while (ptrp1_1 = puVar13, ptrp1_1 < _pval1_1) {
                  pval2 = (float)*ptrp1_1 - val1_1;
                  puVar13 = ptrp2 + 1;
                  dist_2 = (float)*ptrp2 - val2;
                  puVar14 = ptrp_end_2 + 1;
                  ptrmin1_1._4_4_ = (float)*ptrp_end_2 - ptrmin0_2._4_4_;
                  ptrmin1_1._0_4_ =
                       ptrmin1_1._4_4_ * ptrmin1_1._4_4_ + pval2 * pval2 + dist_2 * dist_2;
                  ptrp_end_2 = puVar14;
                  ptrp2 = puVar13;
                  puVar13 = ptrp1_1 + 1;
                  if (ptrmin1_1._0_4_ < ptrmin0_2._0_4_) {
                    ptrp0_2 = ptrp1_1;
                    ptrmin0_2._0_4_ = ptrmin1_1._0_4_;
                  }
                }
                ptrmin2 = ptrp0_2 + local_70;
                _err1_1 = ptrmin2 + local_70;
                pfVar9 = ptrs1_2 + 1;
                *ptrs1_2 = val1_1;
                err2 = (val1_1 - (float)*ptrp0_2) * local_84;
                pfVar10 = ptrs2 + 1;
                *ptrs2 = val2;
                z_3 = (int)((val2 - (float)*ptrmin2) * local_84);
                pfVar11 = ptrsn0_2 + 1;
                *ptrsn0_2 = ptrmin0_2._4_4_;
                y_3 = (int)((ptrmin0_2._4_4_ - (float)*_err1_1) * local_84);
                *pfVar9 = err2 * 7.0 + *pfVar9;
                *pfVar10 = (float)z_3 * 7.0 + *pfVar10;
                *pfVar11 = (float)y_3 * 7.0 + *pfVar11;
                ptrsn1_1[-1] = err2 * 3.0 + ptrsn1_1[-1];
                ptrsn2[-1] = (float)z_3 * 3.0 + ptrsn2[-1];
                __val0_2[-1] = (float)y_3 * 3.0 + __val0_2[-1];
                pfVar12 = ptrsn1_1 + 1;
                *ptrsn1_1 = err2 * 5.0 + *ptrsn1_1;
                pfVar15 = ptrsn2 + 1;
                *ptrsn2 = (float)z_3 * 5.0 + *ptrsn2;
                pfVar16 = __val0_2 + 1;
                *__val0_2 = (float)y_3 * 5.0 + *__val0_2;
                *pfVar12 = err2 + *pfVar12;
                *pfVar15 = (float)z_3 + *pfVar15;
                *pfVar16 = (float)y_3 + *pfVar16;
                if ((local_4d & 1) == 0) {
                  *puStack_80 = (int)ptrp0_2 - (int)pCStack_48->_data;
                }
                else {
                  *puStack_80 = (uint)*ptrp0_2;
                  *ptrd2 = (uint)*ptrmin2;
                  *_y_2 = (uint)*_err1_1;
                  _y_2 = _y_2 + 1;
                  ptrd2 = ptrd2 + 1;
                }
                puStack_80 = puStack_80 + 1;
                __val0_2 = pfVar16;
                ptrsn2 = pfVar15;
                ptrsn1_1 = pfVar12;
                ptrsn0_2 = pfVar11;
                ptrs2 = pfVar10;
                ptrs1_2 = pfVar9;
              }
              cimg::swap<float*>(&cache_next,(float **)&cwhd);
            }
          }
        }
        else {
          for (local_300 = 0; (int)local_300 < (int)this->_depth; local_300 = local_300 + 1) {
            for (ptrc._4_4_ = 0; iVar5 = ptrc._4_4_, ptrc._4_4_ < (int)this->_height;
                ptrc._4_4_ = ptrc._4_4_ + 1) {
              iVar7 = height(this);
              if (iVar5 < iVar7 + -2) {
                puStack_310 = (uchar *)cwhd;
                for (_ptrc._4_4_ = 0; (int)_ptrc._4_4_ < (int)this->_spectrum;
                    _ptrc._4_4_ = _ptrc._4_4_ + 1) {
                  _ptrs = puStack_310;
                  pbStack_328 = data(this,0,ptrc._4_4_ + 1,local_300,_ptrc._4_4_);
                  for (ptrs._4_4_ = 0; ptrs._4_4_ < (int)this->_width; ptrs._4_4_ = ptrs._4_4_ + 1)
                  {
                    *(float *)_ptrs = (float)*pbStack_328;
                    pbStack_328 = pbStack_328 + 1;
                    _ptrs = _ptrs + 4;
                  }
                  puStack_310 = puStack_310 + _y * 4;
                }
              }
              ptrsn = cache_next;
              _distmin_3 = cwhd;
              for (ptrmin._4_4_ = 0; ptrmin._4_4_ < (int)this->_width;
                  ptrmin._4_4_ = ptrmin._4_4_ + 1) {
                ptrmin._0_4_ = cimg::type<float>::max();
                ptrp = pCStack_48->_data;
                ptrp_end_3 = pCStack_48->_data;
                puStack_360 = ptrp_end_3 + local_70;
                for (; ptrp_end_3 < puStack_360; ptrp_end_3 = ptrp_end_3 + 1) {
                  _ptrs_2._4_4_ = 0.0;
                  _ptrp = (uchar *)ptrsn;
                  __val = ptrp_end_3;
                  for (val = 0.0; (int)val < (int)this->_spectrum; val = (Tfloat)((int)val + 1)) {
                    local_380 = *(float *)_ptrp;
                    if (local_90 <= local_380) {
                      local_630 = local_380;
                      if (cache._data._4_4_ < local_380) {
                        local_630 = cache._data._4_4_;
                      }
                      local_62c = local_630;
                    }
                    else {
                      local_62c = local_90;
                    }
                    _ptrmin._4_4_ = local_62c;
                    *(float *)_ptrp = local_62c;
                    _ptrmin._0_4_ = local_62c - (float)*__val;
                    fVar17 = cimg::sqr<float>((float *)&_ptrmin);
                    _ptrs_2._4_4_ = fVar17 + _ptrs_2._4_4_;
                    _ptrp = _ptrp + _y * 4;
                    __val = __val + local_70;
                  }
                  if (_ptrs_2._4_4_ < ptrmin._0_4_) {
                    ptrp = ptrp_end_3;
                    ptrmin._0_4_ = _ptrs_2._4_4_;
                  }
                }
                _ptrs_1 = (Tfloat *)ptrp;
                _ptrsn = ptrsn;
                _err = (float *)(_distmin_3 - 4);
                for (_ptrd._4_4_ = 0; _ptrd._4_4_ < (int)this->_spectrum;
                    _ptrd._4_4_ = _ptrd._4_4_ + 1) {
                  pfVar9 = _ptrsn + 1;
                  _ptrd._0_4_ = (*_ptrsn - (float)*(byte *)_ptrs_1) * local_84;
                  *pfVar9 = _ptrd._0_4_ * 7.0 + *pfVar9;
                  *_err = _ptrd._0_4_ * 3.0 + *_err;
                  pfVar10 = _err + 2;
                  _err[1] = _ptrd._0_4_ * 5.0 + _err[1];
                  *pfVar10 = _ptrd._0_4_ + *pfVar10;
                  _ptrs_1 = (Tfloat *)(local_70 + (long)_ptrs_1);
                  _ptrsn = pfVar9 + _y + -1;
                  _err = pfVar10 + _y + -2;
                }
                if ((local_4d & 1) == 0) {
                  *puStack_80 = (int)ptrp - (int)pCStack_48->_data;
                }
                else {
                  _z_4 = puStack_80;
                  for (y_4 = 0; y_4 < (int)this->_spectrum; y_4 = y_4 + 1) {
                    *_z_4 = (uint)*ptrp;
                    _z_4 = _z_4 + pwhd;
                    ptrp = ptrp + local_70;
                  }
                }
                puStack_80 = puStack_80 + 1;
                _distmin_3 = _distmin_3 + 4;
                ptrsn = ptrsn + 1;
              }
              cimg::swap<float*>(&cache_next,(float **)&cwhd);
            }
          }
        }
        CImg<float>::~CImg((CImg<float> *)local_b8);
      }
    }
    return __return_storage_ptr__;
  }
  this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
  uVar1 = this->_width;
  uVar2 = this->_height;
  uVar3 = this->_depth;
  uVar4 = this->_spectrum;
  pixel_type();
  CImgArgumentException::CImgArgumentException
            (this_00,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::index(): Instance and specified colormap (%u,%u,%u,%u,%p) have incompatible dimensions."
             ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgArgumentException::~CImgArgumentException
             );
}

Assistant:

CImg<typename CImg<t>::Tuint>
    get_index(const CImg<t>& colormap, const float dithering=1, const bool map_indexes=true) const {
      if (colormap._spectrum!=_spectrum)
        throw CImgArgumentException(_cimg_instance
                                    "index(): Instance and specified colormap (%u,%u,%u,%u,%p) "
                                    "have incompatible dimensions.",
                                    cimg_instance,
                                    colormap._width,colormap._height,colormap._depth,colormap._spectrum,colormap._data);

      typedef typename CImg<t>::Tuint tuint;
      if (is_empty()) return CImg<tuint>();
      const ulongT
        whd = (ulongT)_width*_height*_depth,
        pwhd = (ulongT)colormap._width*colormap._height*colormap._depth;
      CImg<tuint> res(_width,_height,_depth,map_indexes?_spectrum:1);
      if (dithering>0) { // Dithered versions
        tuint *ptrd = res._data;
        const float ndithering = cimg::cut(dithering,0,1)/16;
        Tfloat valm = 0, valM = (Tfloat)max_min(valm);
        if (valm==valM && valm>=0 && valM<=255) { valm = 0; valM = 255; }
        CImg<Tfloat> cache = get_crop(-1,0,0,0,_width,1,0,_spectrum - 1);
        Tfloat *cache_current = cache.data(1,0,0,0), *cache_next = cache.data(1,1,0,0);
        const ulongT cwhd = (ulongT)cache._width*cache._height*cache._depth;
        switch (_spectrum) {
        case 1 : { // Optimized for scalars
          cimg_forYZ(*this,y,z) {
            if (y<height() - 2) {
              Tfloat *ptrc0 = cache_next; const T *ptrs0 = data(0,y + 1,z,0);
              cimg_forX(*this,x) *(ptrc0++) = (Tfloat)*(ptrs0++);
            }
            Tfloat *ptrs0 = cache_current, *ptrsn0 = cache_next;
            cimg_forX(*this,x) {
              const Tfloat _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp_end = ptrp0 + pwhd; ptrp0<ptrp_end; ) {
                const Tfloat pval0 = (Tfloat)*(ptrp0++) - val0, dist = pval0*pval0;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const Tfloat err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering;
              *ptrs0+=7*err0; *(ptrsn0 - 1)+=3*err0; *(ptrsn0++)+=5*err0; *ptrsn0+=err0;
              if (map_indexes) *(ptrd++) = (tuint)*ptrmin0; else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        case 2 : { // Optimized for 2D vectors
          tuint *ptrd1 = ptrd + whd;
          cimg_forYZ(*this,y,z) {
            if (y<height() - 2) {
              Tfloat *ptrc0 = cache_next, *ptrc1 = ptrc0 + cwhd;
              const T *ptrs0 = data(0,y + 1,z,0), *ptrs1 = ptrs0 + whd;
              cimg_forX(*this,x) { *(ptrc0++) = (Tfloat)*(ptrs0++); *(ptrc1++) = (Tfloat)*(ptrs1++); }
            }
            Tfloat
              *ptrs0 = cache_current, *ptrs1 = ptrs0 + cwhd,
              *ptrsn0 = cache_next, *ptrsn1 = ptrsn0 + cwhd;
            cimg_forX(*this,x) {
              const Tfloat
                _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0,
                _val1 = (Tfloat)*ptrs1, val1 = _val1<valm?valm:_val1>valM?valM:_val1;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp1 = ptrp0 + pwhd, *ptrp_end = ptrp1; ptrp0<ptrp_end; ) {
                const Tfloat
                  pval0 = (Tfloat)*(ptrp0++) - val0, pval1 = (Tfloat)*(ptrp1++) - val1,
                  dist = pval0*pval0 + pval1*pval1;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const t *const ptrmin1 = ptrmin0 + pwhd;
              const Tfloat
                err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering,
                err1 = ((*(ptrs1++)=val1) - (Tfloat)*ptrmin1)*ndithering;
              *ptrs0+=7*err0; *ptrs1+=7*err1;
              *(ptrsn0 - 1)+=3*err0; *(ptrsn1 - 1)+=3*err1;
              *(ptrsn0++)+=5*err0; *(ptrsn1++)+=5*err1;
              *ptrsn0+=err0; *ptrsn1+=err1;
              if (map_indexes) { *(ptrd++) = (tuint)*ptrmin0; *(ptrd1++) = (tuint)*ptrmin1; }
              else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        case 3 : { // Optimized for 3D vectors (colors)
          tuint *ptrd1 = ptrd + whd, *ptrd2 = ptrd1 + whd;
          cimg_forYZ(*this,y,z) {
            if (y<height() - 2) {
              Tfloat *ptrc0 = cache_next, *ptrc1 = ptrc0 + cwhd, *ptrc2 = ptrc1 + cwhd;
              const T *ptrs0 = data(0,y + 1,z,0), *ptrs1 = ptrs0 + whd, *ptrs2 = ptrs1 + whd;
              cimg_forX(*this,x) {
                *(ptrc0++) = (Tfloat)*(ptrs0++); *(ptrc1++) = (Tfloat)*(ptrs1++); *(ptrc2++) = (Tfloat)*(ptrs2++);
              }
            }
            Tfloat
              *ptrs0 = cache_current, *ptrs1 = ptrs0 + cwhd, *ptrs2 = ptrs1 + cwhd,
              *ptrsn0 = cache_next, *ptrsn1 = ptrsn0 + cwhd, *ptrsn2 = ptrsn1 + cwhd;
            cimg_forX(*this,x) {
              const Tfloat
                _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0,
                _val1 = (Tfloat)*ptrs1, val1 = _val1<valm?valm:_val1>valM?valM:_val1,
                _val2 = (Tfloat)*ptrs2, val2 = _val2<valm?valm:_val2>valM?valM:_val2;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp1 = ptrp0 + pwhd, *ptrp2 = ptrp1 + pwhd,
                     *ptrp_end = ptrp1; ptrp0<ptrp_end; ) {
                const Tfloat
                  pval0 = (Tfloat)*(ptrp0++) - val0,
                  pval1 = (Tfloat)*(ptrp1++) - val1,
                  pval2 = (Tfloat)*(ptrp2++) - val2,
                  dist = pval0*pval0 + pval1*pval1 + pval2*pval2;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const t *const ptrmin1 = ptrmin0 + pwhd, *const ptrmin2 = ptrmin1 + pwhd;
              const Tfloat
                err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering,
                err1 = ((*(ptrs1++)=val1) - (Tfloat)*ptrmin1)*ndithering,
                err2 = ((*(ptrs2++)=val2) - (Tfloat)*ptrmin2)*ndithering;

              *ptrs0+=7*err0; *ptrs1+=7*err1; *ptrs2+=7*err2;
              *(ptrsn0 - 1)+=3*err0; *(ptrsn1 - 1)+=3*err1; *(ptrsn2 - 1)+=3*err2;
              *(ptrsn0++)+=5*err0; *(ptrsn1++)+=5*err1; *(ptrsn2++)+=5*err2;
              *ptrsn0+=err0; *ptrsn1+=err1; *ptrsn2+=err2;

              if (map_indexes) {
                *(ptrd++) = (tuint)*ptrmin0; *(ptrd1++) = (tuint)*ptrmin1; *(ptrd2++) = (tuint)*ptrmin2;
              } else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        default : // Generic version
          cimg_forYZ(*this,y,z) {
            if (y<height() - 2) {
              Tfloat *ptrc = cache_next;
              cimg_forC(*this,c) {
                Tfloat *_ptrc = ptrc; const T *_ptrs = data(0,y + 1,z,c);
                cimg_forX(*this,x) *(_ptrc++) = (Tfloat)*(_ptrs++);
                ptrc+=cwhd;
              }
            }
            Tfloat *ptrs = cache_current, *ptrsn = cache_next;
            cimg_forX(*this,x) {
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin = colormap._data;
              for (const t *ptrp = colormap._data, *ptrp_end = ptrp + pwhd; ptrp<ptrp_end; ++ptrp) {
                Tfloat dist = 0; Tfloat *_ptrs = ptrs; const t *_ptrp = ptrp;
                cimg_forC(*this,c) {
                  const Tfloat _val = *_ptrs, val = _val<valm?valm:_val>valM?valM:_val;
                  dist+=cimg::sqr((*_ptrs=val) - (Tfloat)*_ptrp); _ptrs+=cwhd; _ptrp+=pwhd;
                }
                if (dist<distmin) { ptrmin = ptrp; distmin = dist; }
              }
              const t *_ptrmin = ptrmin; Tfloat *_ptrs = ptrs++, *_ptrsn = (ptrsn++) - 1;
              cimg_forC(*this,c) {
                const Tfloat err = (*(_ptrs++) - (Tfloat)*_ptrmin)*ndithering;
                *_ptrs+=7*err; *(_ptrsn++)+=3*err; *(_ptrsn++)+=5*err; *_ptrsn+=err;
                _ptrmin+=pwhd; _ptrs+=cwhd - 1; _ptrsn+=cwhd - 2;
              }
              if (map_indexes) {
                tuint *_ptrd = ptrd++;
                cimg_forC(*this,c) { *_ptrd = (tuint)*ptrmin; _ptrd+=whd; ptrmin+=pwhd; }
              }
              else *(ptrd++) = (tuint)(ptrmin - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        }